

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InetAddress.cpp
# Opt level: O1

string * __thiscall
sznet::net::InetAddress::toIpPort_abi_cxx11_(string *__return_storage_ptr__,InetAddress *this)

{
  sockaddr *addr;
  size_t sVar1;
  char acStack_58 [8];
  char buf [64];
  
  acStack_58[0] = '\0';
  acStack_58[1] = '\0';
  acStack_58[2] = '\0';
  acStack_58[3] = '\0';
  acStack_58[4] = '\0';
  acStack_58[5] = '\0';
  acStack_58[6] = '\0';
  acStack_58[7] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0x20] = '\0';
  buf[0x21] = '\0';
  buf[0x22] = '\0';
  buf[0x23] = '\0';
  buf[0x24] = '\0';
  buf[0x25] = '\0';
  buf[0x26] = '\0';
  buf[0x27] = '\0';
  buf[0x28] = '\0';
  buf[0x29] = '\0';
  buf[0x2a] = '\0';
  buf[0x2b] = '\0';
  buf[0x2c] = '\0';
  buf[0x2d] = '\0';
  buf[0x2e] = '\0';
  buf[0x2f] = '\0';
  buf[0x30] = '\0';
  buf[0x31] = '\0';
  buf[0x32] = '\0';
  buf[0x33] = '\0';
  buf[0x34] = '\0';
  buf[0x35] = '\0';
  buf[0x36] = '\0';
  buf[0x37] = '\0';
  addr = sockets::sz_sockaddr_cast((sockaddr_in6 *)this);
  sockets::sz_toipport(acStack_58,0x40,addr);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_58);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_58,buf + (sVar1 - 8));
  return __return_storage_ptr__;
}

Assistant:

string InetAddress::toIpPort() const
{
	char buf[64] = "";
	sockets::sz_toipport(buf, sizeof(buf), getSockAddr());
	return buf;
}